

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.hpp
# Opt level: O0

bool __thiscall just::test::test_manager::run(test_manager *this,ostream *report_)

{
  bool bVar1;
  pointer this_00;
  size_type sVar2;
  ostream *poVar3;
  __normal_iterator<const_just::test::test_case_*,_std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>_>
  local_30;
  const_iterator e;
  const_iterator i;
  int failures;
  ostream *report__local;
  test_manager *this_local;
  
  i._M_current._4_4_ = 0;
  e = std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>::begin
                (&this->_cases);
  local_30._M_current =
       (test_case *)
       std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>::end
                 (&this->_cases);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&e,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_just::test::test_case_*,_std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>_>
              ::operator->(&e);
    bVar1 = test_case::run(this_00,report_);
    if (!bVar1) {
      i._M_current._4_4_ = i._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_just::test::test_case_*,_std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>_>
    ::operator++(&e);
  }
  sVar2 = std::vector<just::test::test_case,_std::allocator<just::test::test_case>_>::size
                    (&this->_cases);
  poVar3 = (ostream *)std::ostream::operator<<(report_,sVar2);
  poVar3 = std::operator<<(poVar3," test cases finished.");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  if (i._M_current._4_4_ < 1) {
    poVar3 = std::operator<<(report_,"  All succeeded.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar3 = std::operator<<(report_,"  ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,i._M_current._4_4_);
    poVar3 = std::operator<<(poVar3," failed.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  return i._M_current._4_4_ == 0;
}

Assistant:

bool run(std::ostream& report_) const
      {
        int failures = 0;
        for (
          std::vector<test_case>::const_iterator
            i = _cases.begin(),
            e = _cases.end();
          i != e;
          ++i
        )
        {
          if (!i->run(report_))
          {
            ++failures;
          }
        }
        report_ << _cases.size() << " test cases finished." << std::endl;
        if (failures > 0)
        {
          report_ << "  " << failures << " failed." << std::endl;
        }
        else
        {
          report_ << "  All succeeded." << std::endl;
        }
        return failures == 0;
      }